

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_generation_iterator.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_11617e::GenerationIterator::add_transaction(GenerationIterator *this)

{
  pair<std::shared_ptr<int>,_pstore::typed_address<int>_> local_70;
  transaction<pstore::lock_guard<pstore::transaction_mutex>_> transaction;
  
  pstore::begin(&transaction,&this->db_);
  pstore::transaction_base::alloc_rw<int,void>(&local_70,&transaction.super_transaction_base,1);
  *local_70.first.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr = 0x25;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_70.first.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  pstore::transaction_base::commit(&transaction.super_transaction_base);
  pstore::transaction<pstore::lock_guard<pstore::transaction_mutex>_>::~transaction(&transaction);
  return;
}

Assistant:

void add_transaction () {
            auto transaction = pstore::begin (db_);
            *(transaction.alloc_rw<int> ().first) = 37;
            transaction.commit ();
        }